

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O0

void glfwSetGamma(GLFWmonitor *handle,float gamma)

{
  float in_XMM0_Da;
  float fVar1;
  float value;
  GLFWgammaramp ramp;
  unsigned_short values [256];
  int i;
  GLFWgammaramp *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  float in_stack_fffffffffffffdc4;
  undefined2 local_218 [260];
  int local_10;
  float local_c;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if ((in_XMM0_Da <= 0.0) || (3.4028235e+38 < in_XMM0_Da)) {
    _glfwInputError((int)(double)in_XMM0_Da,(char *)0x10004,"Invalid gamma value %f");
  }
  else {
    local_c = in_XMM0_Da;
    for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
      fVar1 = powf((float)local_10 / 255.0,1.0 / local_c);
      in_stack_fffffffffffffdc4 = fVar1 * 65535.0 + 0.5;
      if (65535.0 < in_stack_fffffffffffffdc4) {
        in_stack_fffffffffffffdc4 = 65535.0;
      }
      local_218[local_10] = (short)(int)in_stack_fffffffffffffdc4;
    }
    glfwSetGammaRamp((GLFWmonitor *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     in_stack_fffffffffffffdb8);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetGamma(GLFWmonitor* handle, float gamma)
{
    int i;
    unsigned short values[256];
    GLFWgammaramp ramp;
    assert(handle != NULL);
    assert(gamma == gamma);
    assert(gamma >= 0.f);
    assert(gamma <= FLT_MAX);

    _GLFW_REQUIRE_INIT();

    if (gamma != gamma || gamma <= 0.f || gamma > FLT_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid gamma value %f", gamma);
        return;
    }

    for (i = 0;  i < 256;  i++)
    {
        float value;

        // Calculate intensity
        value = i / 255.f;
        // Apply gamma curve
        value = powf(value, 1.f / gamma) * 65535.f + 0.5f;

        // Clamp to value range
        if (value > 65535.f)
            value = 65535.f;

        values[i] = (unsigned short) value;
    }

    ramp.red = values;
    ramp.green = values;
    ramp.blue = values;
    ramp.size = 256;

    glfwSetGammaRamp(handle, &ramp);
}